

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::evalTexture2DShadowProjLod
               (ShaderEvalContext *c,TexLookupParams *param_2)

{
  float fVar1;
  
  fVar1 = c->in[0].m_data[3];
  fVar1 = texture2DShadow(c,c->in[0].m_data[2] / fVar1,c->in[0].m_data[0] / fVar1,
                          c->in[0].m_data[1] / fVar1,c->in[1].m_data[0]);
  (c->color).m_data[0] = fVar1;
  return;
}

Assistant:

static void		evalTexture2DShadowProjLod			(ShaderEvalContext& c, const TexLookupParams&)		{ c.color.x() = texture2DShadow(c, c.in[0].z()/c.in[0].w(), c.in[0].x()/c.in[0].w(), c.in[0].y()/c.in[0].w(), c.in[1].x()); }